

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigDialog.cpp
# Opt level: O0

void __thiscall
ConfigDialog::ConfigDialog
          (ConfigDialog *this,Config *config,AudioEnumerator *audio,MidiEnumerator *midi,
          QWidget *parent)

{
  QTabWidget *pQVar1;
  GeneralConfigTab *pGVar2;
  GeneralConfig *config_00;
  AppearanceConfigTab *pAVar3;
  FontTable *fonts;
  Palette *pal;
  KeyboardConfigTab *pKVar4;
  PianoInput *input;
  ShortcutTable *shortcuts;
  SoundConfigTab *pSVar5;
  MidiConfig *midiConfig;
  SoundConfig *soundConfig;
  QDialogButtonBox *pQVar6;
  QVBoxLayout *pQVar7;
  ConnectionType type;
  Object local_1e0 [8];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  code *local_1c8;
  undefined8 local_1c0;
  Object local_1b8 [8];
  code *local_1b0;
  undefined8 uStack_1a8;
  code *local_1a0;
  undefined8 local_198;
  Object local_190 [8];
  code *local_188;
  undefined8 uStack_180;
  code *local_178;
  undefined8 local_170;
  undefined1 local_168 [16];
  undefined8 uStack_158;
  code *local_150;
  undefined8 local_148;
  undefined1 local_140 [16];
  undefined8 uStack_130;
  code *local_128;
  undefined8 local_120;
  undefined1 local_118 [16];
  undefined8 uStack_108;
  code *local_100;
  undefined8 local_f8;
  undefined1 local_f0 [16];
  QPushButton *applyButton;
  QFlags<Qt::AlignmentFlag> local_c8;
  QFlags<Qt::AlignmentFlag> local_c4;
  QVBoxLayout *local_c0;
  QVBoxLayout *layout;
  QString local_b0;
  QString local_98;
  QString local_80;
  QString local_68;
  QTabWidget *local_40;
  QTabWidget *tabs;
  QWidget *local_30;
  QWidget *parent_local;
  MidiEnumerator *midi_local;
  AudioEnumerator *audio_local;
  Config *config_local;
  ConfigDialog *this_local;
  
  local_30 = parent;
  parent_local = (QWidget *)midi;
  midi_local = (MidiEnumerator *)audio;
  audio_local = (AudioEnumerator *)config;
  config_local = (Config *)this;
  tabs._0_4_ = Qt::operator|(WindowTitleHint,WindowSystemMenuHint);
  tabs._4_4_ = QFlags<Qt::WindowType>::operator|
                         ((QFlags<Qt::WindowType> *)&tabs,WindowCloseButtonHint);
  QDialog::QDialog(&this->super_QDialog,parent,(QFlags_conflict1 *)(ulong)tabs._4_4_);
  *(undefined ***)this = &PTR_metaObject_002d3550;
  *(undefined ***)&this->field_0x10 = &PTR__ConfigDialog_002d3728;
  this->mConfig = (Config *)audio_local;
  QFlags<Config::Category>::QFlags(&this->mDirty,CategoryNone);
  pQVar1 = (QTabWidget *)operator_new(0x28);
  QTabWidget::QTabWidget(pQVar1,(QWidget *)0x0);
  local_40 = pQVar1;
  pGVar2 = (GeneralConfigTab *)operator_new(0x50);
  config_00 = Config::general((Config *)audio_local);
  GeneralConfigTab::GeneralConfigTab(pGVar2,config_00,(QWidget *)0x0);
  pQVar1 = local_40;
  this->mGeneral = pGVar2;
  pGVar2 = this->mGeneral;
  tr(&local_68,"General",(char *)0x0,-1);
  QTabWidget::addTab((QWidget *)pQVar1,(QString *)pGVar2);
  QString::~QString(&local_68);
  pAVar3 = (AppearanceConfigTab *)operator_new(0x88);
  fonts = Config::fonts((Config *)audio_local);
  pal = Config::palette((Config *)audio_local);
  AppearanceConfigTab::AppearanceConfigTab(pAVar3,fonts,pal,(QWidget *)0x0);
  pQVar1 = local_40;
  this->mAppearance = pAVar3;
  pAVar3 = this->mAppearance;
  tr(&local_80,"Appearance",(char *)0x0,-1);
  QTabWidget::addTab((QWidget *)pQVar1,(QString *)pAVar3);
  QString::~QString(&local_80);
  pKVar4 = (KeyboardConfigTab *)operator_new(0x80);
  input = Config::pianoInput((Config *)audio_local);
  shortcuts = Config::shortcuts((Config *)audio_local);
  KeyboardConfigTab::KeyboardConfigTab(pKVar4,input,shortcuts,(QWidget *)0x0);
  pQVar1 = local_40;
  this->mKeyboard = pKVar4;
  pKVar4 = this->mKeyboard;
  tr(&local_98,"Keyboard",(char *)0x0,-1);
  QTabWidget::addTab((QWidget *)pQVar1,(QString *)pKVar4);
  QString::~QString(&local_98);
  pSVar5 = (SoundConfigTab *)operator_new(0x68);
  midiConfig = Config::midi((Config *)audio_local);
  soundConfig = Config::sound((Config *)audio_local);
  SoundConfigTab::SoundConfigTab
            (pSVar5,midiConfig,soundConfig,(AudioEnumerator *)midi_local,
             (MidiEnumerator *)parent_local,(QWidget *)0x0);
  pQVar1 = local_40;
  this->mSound = pSVar5;
  pSVar5 = this->mSound;
  tr(&local_b0,"Sound / MIDI",(char *)0x0,-1);
  QTabWidget::addTab((QWidget *)pQVar1,(QString *)pSVar5);
  QString::~QString(&local_b0);
  pQVar6 = (QDialogButtonBox *)operator_new(0x28);
  layout._0_4_ = ::operator|(FirstButton,Cancel);
  layout._4_4_ = QFlags<QDialogButtonBox::StandardButton>::operator|
                           ((QFlags<QDialogButtonBox::StandardButton> *)&layout,Apply);
  QDialogButtonBox::QDialogButtonBox
            (pQVar6,(QFlags_conflict1 *)(ulong)layout._4_4_,Horizontal,(QWidget *)0x0);
  this->mButtons = pQVar6;
  pQVar7 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar7);
  pQVar1 = local_40;
  local_c0 = pQVar7;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_c4);
  QBoxLayout::addWidget((QWidget *)pQVar7,(int)pQVar1,(QFlags_conflict1 *)0x1);
  pQVar7 = local_c0;
  pQVar6 = this->mButtons;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_c8);
  QBoxLayout::addWidget((QWidget *)pQVar7,(int)pQVar6,(QFlags_conflict1 *)0x0);
  QLayout::setSizeConstraint((SizeConstraint)local_c0);
  QWidget::setLayout((QLayout *)this);
  tr((QString *)&applyButton,"Configuration",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)this);
  QString::~QString((QString *)&applyButton);
  QDialog::setModal(SUB81(this,0));
  local_f0._8_8_ = QDialogButtonBox::button((StandardButton)this->mButtons);
  QWidget::setEnabled(SUB81(local_f0._8_8_,0));
  local_100 = ConfigTab::dirty;
  local_f8 = 0;
  local_118._8_8_ = setDirty;
  uStack_108 = 0;
  type = (ConnectionType)this;
  QObject::connect<void(ConfigTab::*)(Config::Category),void(ConfigDialog::*)(Config::Category)>
            ((Object *)local_f0,(offset_in_ConfigTab_to_subr)this->mGeneral,
             (Object *)ConfigTab::dirty,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_f0);
  local_128 = ConfigTab::dirty;
  local_120 = 0;
  local_140._8_8_ = setDirty;
  uStack_130 = 0;
  QObject::connect<void(ConfigTab::*)(Config::Category),void(ConfigDialog::*)(Config::Category)>
            ((Object *)local_118,(offset_in_ConfigTab_to_subr)this->mAppearance,
             (Object *)ConfigTab::dirty,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_118);
  local_150 = ConfigTab::dirty;
  local_148 = 0;
  local_168._8_8_ = setDirty;
  uStack_158 = 0;
  QObject::connect<void(ConfigTab::*)(Config::Category),void(ConfigDialog::*)(Config::Category)>
            ((Object *)local_140,(offset_in_ConfigTab_to_subr)this->mKeyboard,
             (Object *)ConfigTab::dirty,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_140);
  local_178 = ConfigTab::dirty;
  local_170 = 0;
  local_188 = setDirty;
  uStack_180 = 0;
  QObject::connect<void(ConfigTab::*)(Config::Category),void(ConfigDialog::*)(Config::Category)>
            ((Object *)local_168,(offset_in_ConfigTab_to_subr)this->mSound,
             (Object *)ConfigTab::dirty,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_168);
  local_1a0 = QAbstractButton::clicked;
  local_198 = 0;
  local_1b0 = apply;
  uStack_1a8 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),bool(ConfigDialog::*)()>
            (local_190,local_f0._8_8_,(Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_190);
  local_1c8 = QDialogButtonBox::accepted;
  local_1c0 = 0;
  uStack_1d0 = 0;
  local_1d8 = 0x1b9;
  QObject::connect<void(QDialogButtonBox::*)(),void(ConfigDialog::*)()>
            (local_1b8,(offset_in_QDialogButtonBox_to_subr)this->mButtons,
             (Object *)QDialogButtonBox::accepted,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_1b8);
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_1e0,(offset_in_QDialogButtonBox_to_subr)this->mButtons,
             (Object *)QDialogButtonBox::rejected,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_1e0);
  return;
}

Assistant:

ConfigDialog::ConfigDialog(
    Config &config,
    AudioEnumerator &audio,
    MidiEnumerator &midi,
    QWidget *parent
) :
    QDialog(parent, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint),
    mConfig(config),
    mDirty(Config::CategoryNone)
{


    auto tabs = new QTabWidget;

    mGeneral = new GeneralConfigTab(config.general());
    tabs->addTab(mGeneral, tr("General"));

    mAppearance = new AppearanceConfigTab(config.fonts(), config.palette());
    tabs->addTab(mAppearance, tr("Appearance"));

    mKeyboard = new KeyboardConfigTab(config.pianoInput(), config.shortcuts());
    tabs->addTab(mKeyboard, tr("Keyboard"));

    mSound = new SoundConfigTab(config.midi(), config.sound(), audio, midi);
    tabs->addTab(mSound, tr("Sound / MIDI"));

    mButtons = new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel | QDialogButtonBox::Apply, Qt::Horizontal);

    auto layout = new QVBoxLayout;
    layout->addWidget(tabs, 1);
    layout->addWidget(mButtons);
    layout->setSizeConstraint(QLayout::SizeConstraint::SetFixedSize);
    setLayout(layout);

    setWindowTitle(tr("Configuration"));
    setModal(true);

    auto applyButton = mButtons->button(QDialogButtonBox::Apply);
    applyButton->setEnabled(false);

    lazyconnect(mGeneral, dirty, this, setDirty);
    lazyconnect(mAppearance, dirty, this, setDirty);
    lazyconnect(mKeyboard, dirty, this, setDirty);
    lazyconnect(mSound, dirty, this, setDirty);

    lazyconnect(applyButton, clicked, this, apply);
    lazyconnect(mButtons, accepted, this, accept);
    lazyconnect(mButtons, rejected, this, reject);

}